

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O0

void duckdb::GetReservoirQuantileDecimalFunction
               (AggregateFunctionSet *set,vector<duckdb::LogicalType,_true> *arguments,
               LogicalType *return_value)

{
  AggregateFunction fun;
  AggregateFunction *function;
  AggregateFunction *this;
  AggregateFunction *__args;
  code *this_00;
  aggregate_update_t in_stack_fffffffffffffc88;
  aggregate_initialize_t in_stack_fffffffffffffc90;
  aggregate_size_t in_stack_fffffffffffffc98;
  LogicalType *in_stack_fffffffffffffca0;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffca8;
  AggregateFunction *in_stack_fffffffffffffcb0;
  aggregate_combine_t in_stack_fffffffffffffcf0;
  aggregate_finalize_t in_stack_fffffffffffffcf8;
  aggregate_simple_update_t in_stack_fffffffffffffd00;
  bind_aggregate_function_t in_stack_fffffffffffffd08;
  aggregate_destructor_t in_stack_fffffffffffffd10;
  aggregate_statistics_t in_stack_fffffffffffffd18;
  aggregate_window_t in_stack_fffffffffffffd20;
  aggregate_serialize_t in_stack_fffffffffffffd28;
  aggregate_deserialize_t in_stack_fffffffffffffd30;
  
  this_00 = BindReservoirQuantileDecimal;
  __args = (AggregateFunction *)0x0;
  this = (AggregateFunction *)0x0;
  function = (AggregateFunction *)0x0;
  AggregateFunction::AggregateFunction
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
             in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
             in_stack_fffffffffffffcf0,in_stack_fffffffffffffcf8,in_stack_fffffffffffffd00,
             in_stack_fffffffffffffd08,in_stack_fffffffffffffd10,in_stack_fffffffffffffd18,
             in_stack_fffffffffffffd20,in_stack_fffffffffffffd28,in_stack_fffffffffffffd30);
  AggregateFunction::AggregateFunction((AggregateFunction *)this_00,__args);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,function);
  AggregateFunction::~AggregateFunction(this);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this_00,
             (LogicalTypeId *)__args);
  AggregateFunction::AggregateFunction((AggregateFunction *)this_00,__args);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,function);
  AggregateFunction::~AggregateFunction(this);
  AggregateFunction::~AggregateFunction(this);
  return;
}

Assistant:

static void GetReservoirQuantileDecimalFunction(AggregateFunctionSet &set, const vector<LogicalType> &arguments,
                                                const LogicalType &return_value) {
	AggregateFunction fun(arguments, return_value, nullptr, nullptr, nullptr, nullptr, nullptr, nullptr,
	                      BindReservoirQuantileDecimal);
	fun.serialize = ReservoirQuantileBindData::Serialize;
	fun.deserialize = ReservoirQuantileBindData::Deserialize;
	set.AddFunction(fun);

	fun.arguments.emplace_back(LogicalType::INTEGER);
	set.AddFunction(fun);
}